

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElement.h
# Opt level: O1

unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
__thiscall
ninx::parser::element::ASTElement::clone<ninx::parser::element::Statement>(ASTElement *this)

{
  long lVar1;
  _func_int **pp_Var2;
  pointer *__ptr;
  long *in_RSI;
  
  lVar1 = (**(code **)(*in_RSI + 0x30))();
  if (lVar1 == 0) {
    pp_Var2 = (_func_int **)0x0;
  }
  else {
    pp_Var2 = (_func_int **)__dynamic_cast(lVar1,&typeinfo,&Statement::typeinfo,0);
  }
  this->_vptr_ASTElement = pp_Var2;
  (**(code **)(*pp_Var2 + 0x20))(pp_Var2,in_RSI[1]);
  (**(code **)(*pp_Var2 + 0x28))(pp_Var2,in_RSI[2]);
  return (__uniq_ptr_data<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> clone() {
                    std::unique_ptr<T> new_obj(dynamic_cast<T*>(clone_impl()));
                    new_obj->set_parent(this->get_parent());
                    new_obj->__set_output_block(this->__get_output_block());
                    return new_obj;
                }